

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O2

apx_socketServerConnection_t * apx_socketServerConnection_new(msocket_t *socket_object)

{
  apx_error_t aVar1;
  apx_socketServerConnection_t *self;
  
  if ((socket_object != (msocket_t *)0x0) &&
     (self = (apx_socketServerConnection_t *)malloc(0x600),
     self != (apx_socketServerConnection_t *)0x0)) {
    aVar1 = apx_socketServerConnection_create(self,socket_object);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_socketServerConnection_t *)0x0;
}

Assistant:

apx_socketServerConnection_t *apx_socketServerConnection_new(SOCKET_TYPE *socket_object)
{
   if (socket_object != NULL)
   {
      apx_socketServerConnection_t *self = (apx_socketServerConnection_t*) malloc(sizeof(apx_socketServerConnection_t));
      if (self != NULL)
      {
         apx_error_t result = apx_socketServerConnection_create(self, socket_object);
         if (result != APX_NO_ERROR)
         {
            free(self);
            self = (apx_socketServerConnection_t*)NULL;
         }
      }
      return self;
   }
   return (apx_socketServerConnection_t*)NULL;
}